

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedefNameTypeResolver.cpp
# Opt level: O0

Type * __thiscall psy::C::TypedefNameTypeResolver::resolve(TypedefNameTypeResolver *this,Type *ty)

{
  TypeKind TVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  FunctionType *this_00;
  const_reference ppTVar4;
  undefined4 extraout_var_01;
  Type *pTVar5;
  undefined4 extraout_var_02;
  TypedefDeclarationSymbol *this_01;
  Compilation *this_02;
  undefined4 extraout_var_03;
  Type *pTVar6;
  undefined4 extraout_var_04;
  Type *local_f8;
  Type *resolvedTy_3;
  Type *unqualTy;
  QualifiedType *qualTy;
  TypedefDeclarationSymbol *tydefDecl;
  TypedefNameType *tydefNameTy;
  Type *resolvedTy_2;
  Type *refedTy;
  PointerType *ptrTy;
  Type *parmTy;
  size_type idx;
  size_type parmsSize;
  ParameterTypes parms;
  Type *resolvedTy_1;
  Type *retTy;
  FunctionType *funcTy;
  Type *resolvedTy;
  Type *elemTy;
  ArrayType *arrTy;
  Type *ty_local;
  TypedefNameTypeResolver *this_local;
  undefined4 extraout_var_00;
  
  TVar1 = Type::kind(ty);
  this_local = (TypedefNameTypeResolver *)ty;
  switch(TVar1) {
  case Array:
    iVar2 = (*ty->_vptr_Type[3])();
    pTVar6 = ArrayType::elementType((ArrayType *)CONCAT44(extraout_var,iVar2));
    pTVar5 = resolve(this,pTVar6);
    if (pTVar5 != pTVar6) {
      ArrayType::resetElementType((ArrayType *)CONCAT44(extraout_var,iVar2),pTVar5);
    }
    break;
  case Basic:
  case Tag:
  case Void:
  case Error:
    break;
  case Function:
    iVar2 = (*ty->_vptr_Type[7])();
    this_00 = (FunctionType *)CONCAT44(extraout_var_00,iVar2);
    pTVar6 = FunctionType::returnType(this_00);
    parms.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)resolve(this,pTVar6);
    if ((Type *)parms.
                super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != pTVar6) {
      FunctionType::setReturnType
                (this_00,(Type *)parms.
                                 super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    FunctionType::parameterTypes
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&parmsSize,
               this_00);
    pTVar6 = (Type *)std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::size
                               ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                                 *)&parmsSize);
    for (parmTy = (Type *)0x0; parmTy < pTVar6; parmTy = (Type *)((long)&parmTy->_vptr_Type + 1)) {
      ppTVar4 = std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::operator[]
                          ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)
                           &parmsSize,(size_type)parmTy);
      pTVar5 = *ppTVar4;
      parms.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)resolve(this,pTVar5);
      if ((Type *)parms.
                  super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage != pTVar5) {
        FunctionType::setParameterType
                  (this_00,(size_type)parmTy,
                   (Type *)parms.
                           super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    std::vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>::~vector
              ((vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> *)&parmsSize);
    break;
  case Pointer:
    iVar2 = (*ty->_vptr_Type[9])();
    pTVar6 = PointerType::referencedType((PointerType *)CONCAT44(extraout_var_01,iVar2));
    pTVar5 = resolve(this,pTVar6);
    if (pTVar5 != pTVar6) {
      PointerType::resetReferencedType((PointerType *)CONCAT44(extraout_var_01,iVar2),pTVar5);
    }
    break;
  case TypedefName:
    iVar2 = (*ty->_vptr_Type[0xb])();
    this_01 = TypedefNameType::declaration((TypedefNameType *)CONCAT44(extraout_var_02,iVar2));
    if (this_01 == (TypedefDeclarationSymbol *)0x0) {
      this_02 = SemanticModel::compilation(this->semaModel_);
      this_local = (TypedefNameTypeResolver *)Compilation::canonicalErrorType(this_02);
    }
    else {
      pTVar6 = TypedefDeclarationSymbol::synonymizedType(this_01);
      this_local = (TypedefNameTypeResolver *)resolve(this,pTVar6);
    }
    break;
  case Qualified:
    iVar2 = (*ty->_vptr_Type[0x11])();
    pTVar6 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar2));
    local_f8 = resolve(this,pTVar6);
    if (local_f8 != pTVar6) {
      TVar1 = Type::kind(local_f8);
      if (TVar1 == Qualified) {
        iVar3 = (*local_f8->_vptr_Type[0x11])();
        local_f8 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var_04,iVar3));
      }
      QualifiedType::resetUnqualifiedType((QualifiedType *)CONCAT44(extraout_var_03,iVar2),local_f8)
      ;
    }
  }
  return (Type *)this_local;
}

Assistant:

const Type* TypedefNameTypeResolver::resolve(const Type* ty)
{
    switch (ty->kind()) {
        case TypeKind::Basic:
        case TypeKind::Void:
        case TypeKind::Tag:
        case TypeKind::Error:
            break;

        case TypeKind::Array: {
            auto arrTy = ty->asArrayType();
            auto elemTy = arrTy->elementType();
            auto resolvedTy = resolve(elemTy);
            if (resolvedTy != elemTy)
                arrTy->resetElementType(resolvedTy);
            break;
        }

        case TypeKind::Function: {
            auto funcTy = ty->asFunctionType();
            auto retTy = funcTy->returnType();
            auto resolvedTy = resolve(retTy);
            if (resolvedTy != retTy)
                funcTy->setReturnType(resolvedTy);
            const auto parms = funcTy->parameterTypes();
            const auto parmsSize = parms.size();
            for (FunctionType::ParameterTypes::size_type idx = 0; idx < parmsSize; ++idx) {
                const Type* parmTy = parms[idx];
                resolvedTy = resolve(parmTy);
                if (resolvedTy != parmTy)
                    funcTy->setParameterType(idx, resolvedTy);
            }
            break;
        }

        case TypeKind::Pointer: {
            auto ptrTy = ty->asPointerType();
            auto refedTy = ptrTy->referencedType();
            auto resolvedTy = resolve(refedTy);
            if (resolvedTy != refedTy)
                ptrTy->resetReferencedType(resolvedTy);
            break;
        }

        case TypeKind::TypedefName: {
            auto tydefNameTy = ty->asTypedefNameType();
            auto tydefDecl = tydefNameTy->declaration();
            if (!tydefDecl)
                return semaModel_->compilation()->canonicalErrorType();
            return resolve(tydefDecl->synonymizedType());
        }

        case TypeKind::Qualified: {
            auto qualTy = ty->asQualifiedType();
            auto unqualTy = qualTy->unqualifiedType();
            auto resolvedTy = resolve(unqualTy);
            if (resolvedTy != unqualTy) {
                qualTy->resetUnqualifiedType(
                        resolvedTy->kind() == TypeKind::Qualified
                            ? resolvedTy->asQualifiedType()->unqualifiedType()
                            : resolvedTy);
            }
            break;
        }
    }

    return ty;
}